

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.cpp
# Opt level: O0

void __thiscall
duckdb::ZSTDCompressionState::CreateEmptySegment(ZSTDCompressionState *this,idx_t row_start)

{
  BlockManager *other;
  BufferManager *pBVar1;
  pointer pCVar2;
  long in_RDI;
  idx_t in_stack_00000038;
  idx_t in_stack_00000040;
  LogicalType *in_stack_00000048;
  CompressionFunction *in_stack_00000050;
  DatabaseInstance *in_stack_00000058;
  BlockManager *in_stack_00000070;
  BufferManager *buffer_manager;
  unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>
  compressed_segment;
  LogicalType *type;
  DatabaseInstance *db;
  BufferHandle *in_stack_ffffffffffffff40;
  undefined1 local_58 [40];
  BufferManager *local_30;
  LogicalType *local_20;
  DatabaseInstance *local_18;
  
  local_18 = ColumnDataCheckpointData::GetDatabase((ColumnDataCheckpointData *)0xa3534d);
  local_20 = ColumnDataCheckpointData::GetType((ColumnDataCheckpointData *)0xa35366);
  CompressionInfo::GetBlockSize((CompressionInfo *)0xa353b1);
  other = CompressionInfo::GetBlockManager((CompressionInfo *)(in_RDI + 8));
  ColumnSegment::CreateTransientSegment
            (in_stack_00000058,in_stack_00000050,in_stack_00000048,in_stack_00000040,
             in_stack_00000038,in_stack_00000070);
  unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::operator=
            ((unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true> *)
             in_stack_ffffffffffffff40,
             (unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true> *)
             other);
  ColumnDataCheckpointData::GetDatabase((ColumnDataCheckpointData *)0xa35415);
  pBVar1 = BufferManager::GetBufferManager((DatabaseInstance *)0xa35426);
  local_30 = pBVar1;
  pCVar2 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
           operator->((unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>
                       *)in_stack_ffffffffffffff40);
  (*pBVar1->_vptr_BufferManager[7])(local_58,pBVar1,&pCVar2->block);
  BufferHandle::operator=(in_stack_ffffffffffffff40,(BufferHandle *)other);
  BufferHandle::~BufferHandle(in_stack_ffffffffffffff40);
  unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::~unique_ptr
            ((unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true> *)
             0xa354a7);
  return;
}

Assistant:

void CreateEmptySegment(idx_t row_start) {
		auto &db = checkpoint_data.GetDatabase();
		auto &type = checkpoint_data.GetType();
		auto compressed_segment = ColumnSegment::CreateTransientSegment(db, function, type, row_start,
		                                                                info.GetBlockSize(), info.GetBlockManager());
		segment = std::move(compressed_segment);

		auto &buffer_manager = BufferManager::GetBufferManager(checkpoint_data.GetDatabase());
		segment_handle = buffer_manager.Pin(segment->block);
	}